

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int comparedUnsignedPair(void *a,void *b)

{
  uint *bu;
  uint *au;
  void *b_local;
  void *a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else if (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) {
    a_local._4_4_ = -1;
  }
  else if (*(uint *)((long)b + 4) < *(uint *)((long)a + 4)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int comparedUnsignedPair(const void* a, const void* b)
{
  const unsigned int* au = ((const unsigned int*)a);
  const unsigned int* bu = ((const unsigned int*)b);
  if (au[0] < bu[0])
    return -1;
  if (au[0] > bu[0])
    return 1;
  if (au[1] < bu[1])
    return -1;
  if (au[1] > bu[1])
    return 1;
  return 0;
}